

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BifFileReader.cpp
# Opt level: O3

void __thiscall BifFileReader<NWN::ResRef16>::~BifFileReader(BifFileReader<NWN::ResRef16> *this)

{
  ~BifFileReader(this);
  operator_delete(this);
  return;
}

Assistant:

BifFileReader< ResRefT >::~BifFileReader(
	)
/*++

Routine Description:

	This routine cleans up an already-existing BifFileReader object.

Arguments:

	None.

Return Value:

	None.

Environment:

	User mode.

--*/
{
	if (m_File != nullptr)
	{

#if defined(_WINDOWS)
		CloseHandle( m_File );
#else
		fclose(m_File);
#endif
		m_File = nullptr;
	}
}